

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.h
# Opt level: O2

void __thiscall
cmQtAutoGenInitializer::GenVarsT::GenVarsT
          (GenVarsT *this,GenT gen,string *genName,string *genNameUpper)

{
  this->Enabled = false;
  this->Gen = gen;
  this->GenName = genName;
  this->GenNameUpper = genNameUpper;
  (this->ExecutableTargetName)._M_dataplus._M_p = (pointer)&(this->ExecutableTargetName).field_2;
  (this->ExecutableTargetName)._M_string_length = 0;
  (this->ExecutableTargetName).field_2._M_local_buf[0] = '\0';
  this->ExecutableTarget = (cmGeneratorTarget *)0x0;
  (this->Executable)._M_dataplus._M_p = (pointer)&(this->Executable).field_2;
  (this->Executable)._M_string_length = 0;
  (this->Executable).field_2._M_local_buf[0] = '\0';
  this->ExecutableExists = false;
  return;
}

Assistant:

GenVarsT(GenT gen, std::string const& genName,
             std::string const& genNameUpper)
      : Gen(gen)
      , GenName(genName)
      , GenNameUpper(genNameUpper){}